

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20240722::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckEnumValueUniqueness(google::protobuf::EnumDescriptorProto_const&,google::protobuf::EnumDescriptor_const*)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer prVar1;
  FormatSpec<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> local_28;
  
  local_28.super_type.spec_.data_ =
       "Enum name %s has the same name as %s if you ignore case and strip out the enum name prefix (if any). (If you are using allow_alias, please assign the same number to each enum value name.)"
  ;
  local_28.super_type.spec_.size_ = 0xbb;
  args = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (**(long **)this + 8);
  prVar1 = container_internal::
           raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::EnumValueDescriptor_*>_>_>
           ::iterator::operator->(*(iterator **)(this + 8));
  StrFormat<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            (__return_storage_ptr__,&local_28,args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (prVar1->second->super_Message).super_MessageLite._internal_metadata_.ptr_);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}